

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O3

void __thiscall FIX::FieldMap::setField(FieldMap *this,FieldBase *field,bool overwrite)

{
  __normal_iterator<FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var1;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,overwrite) != 0) {
    _Var1 = lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                      (this,*(FieldBase **)(this + 8),*(FieldBase **)(this + 0x10),field->m_tag);
    if (_Var1._M_current != *(FieldBase **)(this + 0x10)) {
      std::__cxx11::string::_M_assign((string *)&(_Var1._M_current)->m_string);
      ((_Var1._M_current)->m_metrics).m_length = 0;
      ((_Var1._M_current)->m_metrics).m_checksum = 0;
      ((_Var1._M_current)->m_data)._M_string_length = 0;
      *((_Var1._M_current)->m_data)._M_dataplus._M_p = '\0';
      return;
    }
  }
  addField(this,field);
  return;
}

Assistant:

void setField( const FieldBase& field, bool overwrite = true )
  EXCEPT ( RepeatedTag )
  {
    if( !overwrite )
    {
      addField( field );
    }
    else
    {
      Fields::iterator i = findTag( field.getTag() );
      if( i == m_fields.end() )
      {
        addField( field );
      }
      else
      {
        i->setString( field.getString() );
      }
    }
  }